

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_ref.cpp
# Opt level: O0

int ON_SubDComponentRef::Compare2(ON_SubDComponentRef **lhs,ON_SubDComponentRef **rhs)

{
  ON_SubDComponentRef **rhs_local;
  ON_SubDComponentRef **lhs_local;
  
  if (lhs == rhs) {
    lhs_local._4_4_ = 0;
  }
  else if (lhs == (ON_SubDComponentRef **)0x0) {
    lhs_local._4_4_ = 1;
  }
  else if (rhs == (ON_SubDComponentRef **)0x0) {
    lhs_local._4_4_ = -1;
  }
  else {
    lhs_local._4_4_ = Compare(*lhs,*rhs);
  }
  return lhs_local._4_4_;
}

Assistant:

int ON_SubDComponentRef::Compare2(const ON_SubDComponentRef* const* lhs, const ON_SubDComponentRef* const* rhs)
{
  if (lhs == rhs)
    return 0;
  if (nullptr == lhs)
    return 1;
  if (nullptr == rhs)
    return -1;
  return ON_SubDComponentRef::Compare(*lhs, *rhs);
}